

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong n;
  uint uVar8;
  IdxT lo_00;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint local_4c;
  ulong local_48;
  
  local_48 = (ulong)lo;
  local_4c = rnd;
  if (lo < up) {
    do {
      lo_00 = (IdxT)local_48;
      lua_geti(L,1,local_48);
      uVar3 = (ulong)up;
      lua_geti(L,1,uVar3);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,local_48);
        lua_seti(L,1,uVar3);
      }
      uVar8 = up - lo_00;
      if (uVar8 == 1) {
        return;
      }
      if ((uVar8 < 100) || (local_4c == 0)) {
        uVar7 = up + lo_00 >> 1;
      }
      else {
        uVar5 = uVar8 >> 2;
        uVar6 = local_4c % (uVar5 * 2);
        uVar7 = uVar6 + lo_00 + uVar5;
        if ((CARRY4(uVar6,lo_00 + uVar5)) || (up - uVar5 < uVar7)) {
          __assert_fail("lo + r4 <= p && p <= up - r4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltablib.c"
                        ,0x15d,"IdxT choosePivot(IdxT, IdxT, unsigned int)");
        }
      }
      uVar4 = (ulong)uVar7;
      lua_geti(L,1,uVar4);
      lua_geti(L,1,local_48);
      iVar1 = sort_comp(L,-2,-1);
      if (iVar1 == 0) {
        lua_settop(L,-2);
        lua_geti(L,1,uVar3);
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 != 0) {
          lua_seti(L,1,uVar4);
          goto LAB_00140968;
        }
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,uVar4);
        uVar3 = local_48;
LAB_00140968:
        lua_seti(L,1,uVar3);
      }
      if (uVar8 == 2) {
        return;
      }
      lua_geti(L,1,uVar4);
      lua_pushvalue(L,-1);
      n = (ulong)(up - 1);
      lua_geti(L,1,n);
      uVar3 = n;
      uVar9 = local_48;
      do {
        lua_seti(L,1,uVar4);
        lua_seti(L,1,uVar3);
        iVar1 = (int)uVar9;
        uVar4 = (ulong)(iVar1 + 1);
        lua_geti(L,1,uVar4);
        iVar2 = sort_comp(L,-1,-2);
        uVar9 = uVar4;
        if (iVar2 != 0) {
          uVar8 = iVar1 + 2;
          do {
            uVar7 = uVar8;
            if (up == uVar7) {
              luaL_error(L,"invalid order function for sorting");
            }
            lua_settop(L,-2);
            uVar4 = (ulong)uVar7;
            lua_geti(L,1,uVar4);
            iVar1 = sort_comp(L,-1,-2);
            uVar8 = uVar7 + 1;
          } while (iVar1 != 0);
          uVar9 = (ulong)uVar7;
        }
        while( true ) {
          uVar8 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar8;
          lua_geti(L,1,uVar3);
          iVar1 = sort_comp(L,-3,-1);
          uVar7 = (uint)uVar9;
          if (iVar1 == 0) break;
          if (uVar8 < uVar7) {
            luaL_error(L,"invalid order function for sorting");
          }
          lua_settop(L,-2);
        }
      } while (uVar7 <= uVar8);
      lua_settop(L,-2);
      lua_seti(L,1,n);
      lua_seti(L,1,uVar4);
      uVar8 = up - uVar7;
      if (uVar7 - lo_00 < uVar8) {
        auxsort(L,lo_00,uVar7 - 1,local_4c);
        local_48 = (ulong)(uVar7 + 1);
        uVar8 = uVar7 - lo_00;
      }
      else {
        auxsort(L,uVar7 + 1,up,local_4c);
        up = uVar7 - 1;
      }
      if (uVar8 < up - (uint)local_48 >> 7) {
        uVar3 = clock();
        uVar4 = time((time_t *)0x0);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar3;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar4;
        auVar10 = vphaddd_avx(auVar10,auVar11);
        auVar10 = vpshufd_avx(auVar10,0x88);
        auVar10 = vphaddd_avx(auVar10,auVar10);
        local_4c = auVar10._0_4_;
      }
    } while ((uint)local_48 < up);
  }
  return;
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up,
                                   unsigned int rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    lua_geti(L, 1, lo);
    lua_geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    lua_geti(L, 1, p);
    lua_geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      lua_geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    lua_geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    lua_geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot();  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}